

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O2

void __thiscall
gmlc::concurrency::DelayedDestructor<helics::Core>::DelayedDestructor
          (DelayedDestructor<helics::Core> *this,
          function<void_(std::shared_ptr<helics::Core>_&)> *callFirst)

{
  (this->ElementsToBeDestroyed).
  super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ElementsToBeDestroyed).
  super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->destructionLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->ElementsToBeDestroyed).
  super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->destructionLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->destructionLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->destructionLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->destructionLock).super___mutex_base._M_mutex + 8) = 0;
  std::function<void_(std::shared_ptr<helics::Core>_&)>::function
            (&this->callBeforeDeleteFunction,callFirst);
  TripWireDetector::TripWireDetector(&this->tripDetect);
  return;
}

Assistant:

explicit DelayedDestructor(
        std::function<void(std::shared_ptr<X>& ptr)> callFirst):
        callBeforeDeleteFunction(std::move(callFirst))
    {
    }